

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O2

void __thiscall XmlOutput::addAttribute(XmlOutput *this,QString *attribute,QString *value)

{
  QTextStream *pQVar1;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->currentState < Attribute) {
    local_50.d._0_4_ = 2;
    local_50._4_8_ = 0;
    local_50._12_8_ = 0;
    local_50.size._4_4_ = 0;
    local_38 = "default";
    if ((this->tagStack).super_QList<QString>.d.size == 0) {
      this_00 = &local_80;
      QString::toLatin1_helper((QString *)this_00);
      if (local_80.ptr == (char16_t *)0x0) {
        local_80.ptr = (char16_t *)&QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&local_50,"<%s>: Cannot add attribute (%s) since tag\'s not open","Root",
                 local_80.ptr);
    }
    else {
      QList<QString>::end(&(this->tagStack).super_QList<QString>);
      this_00 = &local_68;
      QString::toLatin1_helper((QString *)this_00);
      if (local_68.ptr == (char16_t *)0x0) {
        local_68.ptr = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_80);
      if (local_80.ptr == (char16_t *)0x0) {
        local_80.ptr = (char16_t *)&QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&local_50,"<%s>: Cannot add attribute (%s) since tag\'s not open",
                 local_68.ptr,local_80.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_80);
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this_00);
  }
  else {
    if (this->format == NewLine) {
      Qt::endl(this->xmlFile);
    }
    pQVar1 = (QTextStream *)QTextStream::operator<<(this->xmlFile,(QString *)&this->currentIndent);
    doConversion((QString *)&local_50,this,attribute);
    pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&local_50);
    pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"=\"");
    doConversion((QString *)&local_68,this,value);
    pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&local_68);
    QTextStream::operator<<(pQVar1,"\"");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::addAttribute(const QString &attribute, const QString &value)
{
     switch(currentState) {
        case Bare:
        case Tag:
            //warn_msg(WarnLogic, "<%s>: Cannot add attribute since tags not open", tagStack.last().toLatin1().constData());
            qDebug("<%s>: Cannot add attribute (%s) since tag's not open",
                   (tagStack.size() ? tagStack.last().toLatin1().constData() : "Root"),
                   attribute.toLatin1().constData());
            return;
        case Attribute:
            break;
    }
    if (format == NewLine)
        xmlFile << Qt::endl;
    xmlFile << currentIndent << doConversion(attribute) << "=\"" << doConversion(value) << "\"";
}